

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_GLSL_TEXLDD(Context *ctx)

{
  if (ctx->glsl_generated_texldd_setup == 0) {
    ctx->glsl_generated_texldd_setup = 1;
    push_output(ctx,&ctx->preflight);
    output_line(ctx,"#if GL_ARB_shader_texture_lod");
    output_line(ctx,"#extension GL_ARB_shader_texture_lod : enable");
    output_line(ctx,"#define texture2DGrad texture2DGradARB");
    output_line(ctx,"#define texture2DProjGrad texture2DProjARB");
    output_line(ctx,"#elif GL_EXT_gpu_shader4");
    output_line(ctx,"#extension GL_EXT_gpu_shader4 : enable");
    output_line(ctx,"#else");
    output_line(ctx,"#define texture2DGrad(a,b,c,d) texture2D(a,b)");
    output_line(ctx,"#define texture2DProjGrad(a,b,c,d) texture2DProj(a,b)");
    output_line(ctx,"#endif");
    output_blank_line(ctx);
    pop_output(ctx);
  }
  glsl_texld(ctx,1);
  return;
}

Assistant:

static void emit_GLSL_TEXLDD(Context *ctx)
{
    // !!! FIXME:
    // GLSL 1.30 introduced textureGrad() for this, but it looks like the
    //  functions are overloaded instead of texture2DGrad() (etc).

    // GL_shader_texture_lod and GL_EXT_gpu_shader4 added texture2DGrad*(),
    //  so we'll use them if available. Failing that, we'll just fallback
    //  to a regular texture2D call and hope the mipmap it chooses is close
    //  enough.
    if (!ctx->glsl_generated_texldd_setup)
    {
        ctx->glsl_generated_texldd_setup = 1;
        push_output(ctx, &ctx->preflight);
        output_line(ctx, "#if GL_ARB_shader_texture_lod");
        output_line(ctx, "#extension GL_ARB_shader_texture_lod : enable");
        output_line(ctx, "#define texture2DGrad texture2DGradARB");
        output_line(ctx, "#define texture2DProjGrad texture2DProjARB");
        output_line(ctx, "#elif GL_EXT_gpu_shader4");
        output_line(ctx, "#extension GL_EXT_gpu_shader4 : enable");
        output_line(ctx, "#else");
        output_line(ctx, "#define texture2DGrad(a,b,c,d) texture2D(a,b)");
        output_line(ctx, "#define texture2DProjGrad(a,b,c,d) texture2DProj(a,b)");
        output_line(ctx, "#endif");
        output_blank_line(ctx);
        pop_output(ctx);
    } // if

    glsl_texld(ctx, 1);
}